

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::DeepTiledInputFile::rawTileData
          (DeepTiledInputFile *this,int *dx,int *dy,int *lx,int *ly,char *pixelData,
          uint64_t *pixelDataSize)

{
  ulong uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  int iVar5;
  ostream *poVar6;
  char *pcVar7;
  ArgExc *pAVar8;
  ulong uVar9;
  exr_chunk_info_t cinfo;
  stringstream _iex_throw_s;
  ostream local_198 [376];
  
  iVar5 = exr_read_tile_chunk_info
                    (*(this->_ctxt)._ctxt.
                      super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     ((this->_data).
                      super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->partNumber,*dx,*dy,*lx,*ly,&cinfo);
  if (iVar5 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar6 = std::operator<<(local_198,"Error reading deep tile data from image file \"");
    pcVar7 = Context::fileName(&this->_ctxt);
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::operator<<(poVar6,"\". Unable to query data block information.");
    pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar8,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar8,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  uVar9 = cinfo.sample_count_table_size + cinfo.packed_size + 0x28;
  uVar1 = *pixelDataSize;
  *pixelDataSize = uVar9;
  if ((pixelData != (char *)0x0) && (uVar9 <= uVar1)) {
    *(undefined8 *)pixelData = cinfo._4_8_;
    auVar2[0xc] = cinfo.compression;
    auVar2._0_12_ = ZEXT712(0);
    auVar4[1] = 0;
    auVar4[0] = cinfo.type;
    auVar4._2_3_ = auVar2._10_3_;
    auVar4._5_8_ = 0;
    auVar3[5] = 0;
    auVar3[4] = cinfo.level_y;
    auVar3._6_7_ = SUB137(auVar4 << 0x40,6);
    auVar3._0_4_ = cinfo._20_4_ & 0xff;
    *(long *)(pixelData + 8) = auVar3._0_8_;
    *(uint64_t *)(pixelData + 0x10) = cinfo.sample_count_table_size;
    *(uint64_t *)(pixelData + 0x18) = cinfo.packed_size;
    *(uint64_t *)(pixelData + 0x20) = cinfo.unpacked_size;
    iVar5 = exr_read_deep_chunk(*(this->_ctxt)._ctxt.
                                 super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,((this->_data).
                                          super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->partNumber,&cinfo,
                                pixelData + cinfo.sample_count_table_size + 0x28,pixelData + 0x28);
    if (iVar5 != 0) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
      poVar6 = std::operator<<(local_198,"Error reading deep tiled data from image file \"");
      pcVar7 = Context::fileName(&this->_ctxt);
      poVar6 = std::operator<<(poVar6,pcVar7);
      poVar6 = std::operator<<(poVar6,"\". Unable to read raw tile data of ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::operator<<(poVar6," bytes.");
      pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar8,(stringstream *)&_iex_throw_s);
      __cxa_throw(pAVar8,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
  }
  return;
}

Assistant:

void
DeepTiledInputFile::rawTileData (
    int&      dx,
    int&      dy,
    int&      lx,
    int&      ly,
    char*     pixelData,
    uint64_t& pixelDataSize) const
{
    exr_chunk_info_t cinfo;

    static_assert (sizeof(DeepTileChunkHeader) == 40, "Expect a 40-byte tiled chunk header");

    if (EXR_ERR_SUCCESS == exr_read_tile_chunk_info (
            _ctxt, _data->partNumber, dx, dy, lx, ly, &cinfo))
    {
        uint64_t cbytes;
        cbytes = sizeof (DeepTileChunkHeader);
        cbytes += cinfo.sample_count_table_size;
        cbytes += cinfo.packed_size;

        if (!pixelData || cbytes > pixelDataSize)
        {
            pixelDataSize = cbytes;
            return;
        }

        pixelDataSize = cbytes;

        DeepTileChunkHeader* dch = reinterpret_cast<DeepTileChunkHeader*> (pixelData);
        dch->dx = cinfo.start_x;
        dch->dy = cinfo.start_y;
        dch->lx = cinfo.level_x;
        dch->ly = cinfo.level_y;
        dch->packedCountSize = cinfo.sample_count_table_size;
        dch->packedDataSize = cinfo.packed_size;
        dch->unpackedDataSize = cinfo.unpacked_size;

        pixelData += sizeof(DeepTileChunkHeader);

        if (EXR_ERR_SUCCESS !=
            exr_read_deep_chunk (
                _ctxt,
                _data->partNumber,
                &cinfo,
                pixelData + cinfo.sample_count_table_size,
                pixelData))
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading deep tiled data from image "
                "file \""
                << fileName () << "\". Unable to read raw tile data of "
                << pixelDataSize << " bytes.");
        }
    }
    else
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Error reading deep tile data from image "
            "file \""
            << fileName ()
            << "\". Unable to query data block information.");
    }
}